

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool google::protobuf::compiler::ApplyMapping
               (string_view filename,string_view old_prefix,string_view new_prefix,string *result)

{
  string_view prefix;
  string_view text;
  string_view text_00;
  string_view text_01;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  char *extraout_RDX;
  string_view path;
  string_view path_00;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  compiler *local_148;
  char *local_140;
  undefined1 local_138 [8];
  string_view after_prefix;
  int after_prefix_start;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  char *local_e8;
  allocator<char> local_d9;
  string local_d8 [55];
  allocator<char> local_a1;
  string local_a0 [32];
  char *local_80;
  char *local_78;
  string_view local_70;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 local_40 [8];
  string_view new_prefix_local;
  string_view old_prefix_local;
  string_view filename_local;
  
  new_prefix_local._M_len = (size_t)new_prefix._M_str;
  local_40 = (undefined1  [8])new_prefix._M_len;
  path._M_len = filename._M_str;
  old_prefix_local._M_str = (char *)filename._M_len;
  old_prefix_local._M_len = (size_t)old_prefix._M_str;
  new_prefix_local._M_str = (char *)old_prefix._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&new_prefix_local._M_str);
  if (bVar1) {
    local_50 = old_prefix_local._M_str;
    path._M_str = extraout_RDX;
    local_48 = path._M_len;
    bVar1 = ContainsParentReference((compiler *)old_prefix_local._M_str,path);
    if (bVar1) {
      return false;
    }
    local_60 = old_prefix_local._M_str;
    local_58 = path._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"/");
    text_01._M_str = local_58;
    text_01._M_len = (size_t)local_60;
    bVar1 = absl::lts_20250127::StartsWith(text_01,local_70);
    if (!bVar1) {
      local_80 = old_prefix_local._M_str;
      text_00._M_str = path._M_len;
      text_00._M_len = (size_t)old_prefix_local._M_str;
      local_78 = path._M_len;
      bVar1 = IsWindowsAbsolutePath(text_00);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_a0,(basic_string_view<char,_std::char_traits<char>_> *)local_40,&local_a1);
        std::__cxx11::string::assign((string *)result);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator(&local_a1);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::__cxx11::string::push_back((char)result);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_d8,(basic_string_view<char,_std::char_traits<char>_> *)
                            &old_prefix_local._M_str,&local_d9);
        std::__cxx11::string::append((string *)result);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator(&local_d9);
        return true;
      }
    }
    return false;
  }
  local_f0 = old_prefix_local._M_str;
  local_100 = new_prefix_local._M_str;
  local_f8 = old_prefix_local._M_len;
  text._M_str = path._M_len;
  text._M_len = (size_t)old_prefix_local._M_str;
  prefix._M_str = (char *)old_prefix_local._M_len;
  prefix._M_len = (size_t)new_prefix_local._M_str;
  local_e8 = path._M_len;
  bVar1 = absl::lts_20250127::StartsWith(text,prefix);
  if (bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&old_prefix_local._M_str)
    ;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&new_prefix_local._M_str)
    ;
    if (sVar2 == sVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&after_prefix_start,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_40,
                 (allocator<char> *)((long)&after_prefix._M_str + 7));
      std::__cxx11::string::operator=((string *)result,(string *)&after_prefix_start);
      std::__cxx11::string::~string((string *)&after_prefix_start);
      std::allocator<char>::~allocator((allocator<char> *)((long)&after_prefix._M_str + 7));
      return true;
    }
    after_prefix._M_str._0_4_ = -1;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&new_prefix_local._M_str)
    ;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&old_prefix_local._M_str
                        ,sVar2);
    if (*pvVar4 == '/') {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &new_prefix_local._M_str);
      after_prefix._M_str._0_4_ = (int)sVar2 + 1;
    }
    else {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &new_prefix_local._M_str);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &old_prefix_local._M_str,sVar2 - 1);
      if (*pvVar4 == '/') {
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &new_prefix_local._M_str);
        after_prefix._M_str._0_4_ = (int)sVar2;
      }
    }
    if ((int)after_prefix._M_str != -1) {
      _local_138 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &old_prefix_local._M_str,(long)(int)after_prefix._M_str,
                              0xffffffffffffffff);
      path_00._M_str = local_138._8_8_;
      local_148 = (compiler *)local_138;
      path_00._M_len = (size_t)path_00._M_str;
      local_140 = path_00._M_str;
      bVar1 = ContainsParentReference((compiler *)local_138,path_00);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_168,(basic_string_view<char,_std::char_traits<char>_> *)local_40,&local_169
                  );
        std::__cxx11::string::assign((string *)result);
        std::__cxx11::string::~string(local_168);
        std::allocator<char>::~allocator(&local_169);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::__cxx11::string::push_back((char)result);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_190,(basic_string_view<char,_std::char_traits<char>_> *)local_138,
                   &local_191);
        std::__cxx11::string::append((string *)result);
        std::__cxx11::string::~string(local_190);
        std::allocator<char>::~allocator(&local_191);
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

static bool ApplyMapping(absl::string_view filename,
                         absl::string_view old_prefix,
                         absl::string_view new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (absl::StartsWith(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(std::string(new_prefix));
    if (!result->empty()) result->push_back('/');
    result->append(std::string(filename));
    return true;
  } else if (absl::StartsWith(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = std::string(new_prefix);
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        absl::string_view after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(std::string(new_prefix));
        if (!result->empty()) result->push_back('/');
        result->append(std::string(after_prefix));
        return true;
      }
    }
  }

  return false;
}